

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall slang::driver::Driver::~Driver(Driver *this)

{
  Compilation *in_RDI;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *unaff_retaddr;
  
  std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::~unique_ptr
            ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)in_RDI);
  std::
  vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)unaff_retaddr);
  boost::unordered::
  unordered_flat_set<std::filesystem::__cxx11::path,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  ::~unordered_flat_set
            ((unordered_flat_set<std::filesystem::__cxx11::path,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
              *)0x2bd411);
  Options::~Options((Options *)in_RDI);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(unaff_retaddr);
  SourceLoader::~SourceLoader((SourceLoader *)in_RDI);
  std::shared_ptr<slang::JsonDiagnosticClient>::~shared_ptr
            ((shared_ptr<slang::JsonDiagnosticClient> *)0x2bd455);
  std::shared_ptr<slang::TextDiagnosticClient>::~shared_ptr
            ((shared_ptr<slang::TextDiagnosticClient> *)0x2bd466);
  DiagnosticEngine::~DiagnosticEngine((DiagnosticEngine *)in_RDI);
  SourceManager::~SourceManager((SourceManager *)in_RDI);
  CommandLine::~CommandLine((CommandLine *)in_RDI);
  ast::Compilation::~Compilation(in_RDI);
  return;
}

Assistant:

Driver::~Driver() = default;